

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_gnutar_finish_entry(archive_write *a)

{
  long *plVar1;
  int iVar2;
  int ret;
  gnutar *gnutar;
  archive_write *a_local;
  
  plVar1 = (long *)a->format_data;
  iVar2 = __archive_write_nulls(a,*plVar1 + plVar1[1]);
  plVar1[1] = 0;
  *plVar1 = 0;
  return iVar2;
}

Assistant:

static int
archive_write_gnutar_finish_entry(struct archive_write *a)
{
	struct gnutar *gnutar;
	int ret;

	gnutar = (struct gnutar *)a->format_data;
	ret = __archive_write_nulls(a, (size_t)
	    (gnutar->entry_bytes_remaining + gnutar->entry_padding));
	gnutar->entry_bytes_remaining = gnutar->entry_padding = 0;
	return (ret);
}